

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

ImVector_Pair * ImVector_Pair_ImVector_PairVector(ImVector_Pair *src)

{
  ImVector<ImGuiStorage::ImGuiStoragePair> *this;
  
  this = (ImVector<ImGuiStorage::ImGuiStoragePair> *)ImGui::MemAlloc(0x10);
  ImVector<ImGuiStorage::ImGuiStoragePair>::ImVector(this,src);
  return this;
}

Assistant:

CIMGUI_API ImVector_Pair* ImVector_Pair_ImVector_PairVector(const ImVector_Pair src)
{
    return IM_NEW(ImVector_Pair)(src);
}